

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifnfy(bifcxdef *ctx,int argc)

{
  undefined2 uVar1;
  ushort uVar2;
  voccxdef *ctx_00;
  long lVar3;
  undefined8 uVar4;
  long in_RDI;
  voccxdef *voc;
  uint tm;
  prpnum prp;
  objnum objn;
  int in_stack_ffffffffffffffcc;
  runcxdef *in_stack_ffffffffffffffd0;
  
  ctx_00 = *(voccxdef **)(*(long *)(in_RDI + 8) + 0x70);
  lVar3 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar3 + -0x10;
  if (*(char *)(lVar3 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  uVar1 = *(undefined2 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar3 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar3 + -0x10;
  if (*(char *)(lVar3 + -0x10) != '\r') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  uVar2 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar3 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar3 + -0x10;
  if (*(char *)(lVar3 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  uVar4 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  vocsetfd(ctx_00,(vocddef *)(ulong)CONCAT24(uVar1,(uint)uVar2),(objnum)((ulong)uVar4 >> 0x30),
           (prpnum)((ulong)uVar4 >> 0x20),(uint)uVar4,
           (runsdef *)CONCAT44(in_stack_ffffffffffffffcc,0x407),CONCAT22(uVar1,uVar2));
  return;
}

Assistant:

void bifnfy(bifcxdef *ctx, int argc)
{
    objnum    objn;
    prpnum    prp;
    uint      tm;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 3, argc);            /* check for proper argument count */
    objn = runpopobj(ctx->bifcxrun);
    prp = runpopprp(ctx->bifcxrun);
    tm = runpopnum(ctx->bifcxrun);

    /* a time of zero means every turn */
    if (tm == 0)
        tm = VOCDTIM_EACH_TURN;
    
    vocsetfd(voc, voc->voccxalm, objn, prp, tm,
             (runsdef *)0, ERR_MANYNFY);
}